

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.hpp
# Opt level: O0

void __thiscall henson::NameMap::create_queue(NameMap *this,string *name)

{
  queue<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [3];
  
  __args = local_60;
  std::
  queue<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::deque<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::allocator<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>>>>
  ::
  queue<std::deque<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::allocator<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>>>,void>
            (in_RSI);
  std::
  map<std::__cxx11::string,std::queue<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::deque<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::allocator<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::queue<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::deque<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::allocator<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>>>>>>>
  ::
  emplace<std::__cxx11::string_const&,std::queue<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::deque<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::allocator<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>>>>>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::queue<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::queue<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>
              *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),__args,in_RSI);
  std::
  queue<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~queue((queue<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)0x2d151d);
  return;
}

Assistant:

void        create_queue(const std::string& name)               { queues_.emplace(name, ValueQueue()); }